

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void drawImage4(Array2D<Imf_2_5::Rgba> *px,int w,int h,int xMin,int xMax,int yMin,int yMax,
               int xLevel,int yLevel)

{
  double in_stack_00000040;
  double in_stack_00000048;
  undefined4 in_stack_00000054;
  undefined4 in_stack_0000005c;
  undefined4 in_stack_00000064;
  int in_stack_0000006c;
  int in_stack_00000070;
  int in_stack_00000074;
  int in_stack_00000078;
  int in_stack_0000007c;
  Array2D<Imf_2_5::Rgba> *in_stack_00000080;
  int in_stack_00000090;
  int in_stack_00000098;
  int in_stack_000000a0;
  
  anon_unknown.dwarf_10b1::mndl<Imf_2_5::Rgba>
            (in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074,
             in_stack_00000070,in_stack_0000006c,in_stack_00000090,in_stack_00000098,
             in_stack_000000a0,(double)CONCAT44(in_stack_00000064,yLevel),
             (double)CONCAT44(in_stack_0000005c,xLevel),(double)CONCAT44(in_stack_00000054,yMax),
             in_stack_00000048,in_stack_00000040,(double)px);
  return;
}

Assistant:

void
drawImage4 (Array2D<Rgba> &px,
            int w, int h,
            int xMin, int xMax,
            int yMin, int yMax,
            int xLevel, int yLevel)
{
    mndl (px,
	  w, h,
	  xMin, xMax,
	  yMin, yMax,
	  (1 << xLevel), (1 << yLevel),
	  0.3247, 0.33348,
	  0.4346,
	  double (1 << yLevel) / double (1 << xLevel),
	  0.4, -0.765);
}